

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall
CRegexSearcherSimple::compile_and_search_back
          (CRegexSearcherSimple *this,char *patstr,size_t patlen,char *entirestr,char *searchstr,
          size_t searchlen,int *result_len)

{
  re_status_t rVar1;
  int in_ECX;
  long in_RDI;
  int in_R8D;
  int *in_stack_00000008;
  int m;
  re_compiled_pattern_base pat;
  re_tuple *in_stack_00000078;
  size_t in_stack_00000088;
  char *in_stack_00000090;
  char *in_stack_00000098;
  CRegexSearcher *in_stack_000000a0;
  re_machine *in_stack_000000c0;
  re_group_register *in_stack_000000c8;
  int *in_stack_000000d0;
  re_compiled_pattern_base *in_stack_00000310;
  size_t in_stack_00000318;
  char *in_stack_00000320;
  CRegexParser *in_stack_00000328;
  undefined4 local_44;
  undefined4 local_4;
  
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  clear_group_regs((CRegexSearcherSimple *)0x332b30);
  rVar1 = CRegexParser::compile
                    (in_stack_00000328,in_stack_00000320,in_stack_00000318,in_stack_00000310);
  if (rVar1 == RE_STATUS_SUCCESS) {
    *(undefined4 *)(in_RDI + 0x7c) = local_44;
    local_4 = CRegexSearcher::search_back
                        (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                         (re_compiled_pattern_base *)result_len,in_stack_00000078,in_stack_000000c0,
                         in_stack_000000c8,in_stack_000000d0);
    if (-1 < local_4) {
      *(int *)(in_RDI + 0x74) = (in_R8D - in_ECX) - local_4;
      *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x74) + *in_stack_00000008;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CRegexSearcherSimple::compile_and_search_back(
    const char *patstr, size_t patlen,
    const char *entirestr, const char *searchstr, size_t searchlen,
    int *result_len)
{
    /* no groups yet */
    group_cnt_ = 0;

    /* clear the group registers */
    clear_group_regs();

    /* compile the expression - return failure if we get an error */
    re_compiled_pattern_base pat;
    if (parser_->compile(patstr, patlen, &pat) != RE_STATUS_SUCCESS)
        return -1;

    /* remember the group count from the compiled pattern */
    group_cnt_ = pat.group_cnt;

    /* 
     *   search for the pattern in our copy of the string - use the copy so
     *   that the group registers stay valid even if the caller deallocates
     *   the original string after we return 
     */
    int m = search_back(entirestr, searchstr, searchlen,
                        &pat, parser_->tuple_arr_, &pat.machine,
                        regs_, result_len);

    /* save the match information on success */
    if (m >= 0)
    {
        match_.start_ofs = searchstr - entirestr - m;
        match_.end_ofs = match_.start_ofs + *result_len;
    }

    /* return the result */
    return m;
}